

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::BlockInformation::ConvertFromStruct
          (BlockInformation *this,BlockInformationStruct *data)

{
  BlockInformationStruct *data_local;
  BlockInformation *this_local;
  
  std::__cxx11::string::operator=((string *)&this->block_hash_,(string *)data);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->tx_,&data->tx);
  this->version_ = data->version;
  std::__cxx11::string::operator=((string *)&this->version_hex_,(string *)&data->version_hex);
  std::__cxx11::string::operator=
            ((string *)&this->previousblockhash_,(string *)&data->previousblockhash);
  std::__cxx11::string::operator=((string *)&this->merkleroot_,(string *)&data->merkleroot);
  this->time_ = data->time;
  this->bits_ = data->bits;
  this->nonce_ = data->nonce;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void BlockInformation::ConvertFromStruct(
    const BlockInformationStruct& data) {
  block_hash_ = data.block_hash;
  tx_.ConvertFromStruct(data.tx);
  version_ = data.version;
  version_hex_ = data.version_hex;
  previousblockhash_ = data.previousblockhash;
  merkleroot_ = data.merkleroot;
  time_ = data.time;
  bits_ = data.bits;
  nonce_ = data.nonce;
  ignore_items = data.ignore_items;
}